

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall geometrycentral::surface::SurfaceMesh::compress(SurfaceMesh *this)

{
  _List_node_base *p_Var1;
  
  if (this->isCompressedFlag == false) {
    compressHalfedges(this);
    compressEdges(this);
    compressFaces(this);
    compressVertices(this);
    this->isCompressedFlag = true;
    p_Var1 = (_List_node_base *)&this->compressCallbackList;
    while (p_Var1 = (((_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                       *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)&this->compressCallbackList) {
      ::std::function<void_()>::operator()((function<void_()> *)(p_Var1 + 1));
    }
  }
  return;
}

Assistant:

void SurfaceMesh::compress() {
  if (isCompressed()) {
    return;
  }

  compressHalfedges();
  compressEdges();
  compressFaces();
  compressVertices();
  isCompressedFlag = true;

  for (auto& f : compressCallbackList) {
    f();
  }
}